

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v9::detail::report_error(format_func func,int error_code,char *message)

{
  size_t sVar1;
  memory_buffer full_message;
  
  full_message.super_buffer<char>.ptr_ = full_message.store_;
  full_message.super_buffer<char>.size_ = 0;
  full_message.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0046f6d8;
  full_message.super_buffer<char>.capacity_ = 500;
  (*func)(&full_message.super_buffer<char>,error_code,message);
  sVar1 = fwrite(full_message.super_buffer<char>.ptr_,full_message.super_buffer<char>.size_,1,
                 _stderr);
  if (sVar1 != 0) {
    fputc(10,_stderr);
  }
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&full_message);
  return;
}

Assistant:

FMT_FUNC void report_error(format_func func, int error_code,
                           const char* message) noexcept {
  memory_buffer full_message;
  func(full_message, error_code, message);
  // Don't use fwrite_fully because the latter may throw.
  if (std::fwrite(full_message.data(), full_message.size(), 1, stderr) > 0)
    std::fputc('\n', stderr);
}